

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.cxx
# Opt level: O2

void undo_clear(void)

{
  int in_EDX;
  int extraout_EDX;
  int i;
  int level;
  char filename [2048];
  char acStack_818 [2056];
  
  for (level = 0; level <= undo_max; level = level + 1) {
    undo_filename(level,acStack_818,in_EDX);
    unlink(acStack_818);
    in_EDX = extraout_EDX;
  }
  undo_max = 0;
  undo_last = 0;
  undo_current = 0;
  undo_save = -(uint)(modflag != 0);
  return;
}

Assistant:

void undo_clear() {
  char	filename[FL_PATH_MAX];			// Undo checkpoint filename


  // Remove old checkpoint files...
  for (int i = 0; i <= undo_max; i ++) {
    unlink(undo_filename(i, filename, sizeof(filename)));
  }

  // Reset current, last, and save indices...
  undo_current = undo_last = undo_max = 0;
  if (modflag) undo_save = -1;
  else undo_save = 0;
}